

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_stream_socket.c
# Opt level: O0

oonf_stream_session *
oonf_stream_connect_to(oonf_stream_socket *stream_socket,netaddr_socket *remote)

{
  oonf_log_source oVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int *piVar5;
  oonf_stream_session *poVar6;
  os_fd *poVar7;
  undefined1 local_14f [8];
  netaddr_str nbuf2;
  netaddr_str nbuf1;
  _Bool wait_for_connect;
  netaddr remote_addr;
  os_fd sock;
  oonf_stream_session *session;
  netaddr_socket *remote_local;
  oonf_stream_socket *stream_socket_local;
  int result;
  
  oVar1 = _oonf_stream_socket_subsystem.logging;
  nbuf1.buf[0x36] = '\0';
  if ((log_global_mask[_oonf_stream_socket_subsystem.logging] & 1) != 0) {
    pcVar3 = netaddr_socket_to_string
                       ((netaddr_str *)(nbuf2.buf + 0x36),&stream_socket->local_socket);
    pcVar4 = netaddr_socket_to_string((netaddr_str *)local_14f,remote);
    oonf_log(LOG_SEVERITY_DEBUG,oVar1,"src/base/oonf_stream_socket.c",0x112,(void *)0x0,0,
             "Connect TCP socket from %s to %s",pcVar3,pcVar4);
  }
  iVar2 = os_fd_generic_getsocket
                    ((os_fd *)(remote_addr._addr + 10),&stream_socket->local_socket,true,0,
                     (os_interface *)0x0,_oonf_stream_socket_subsystem.logging);
  if (iVar2 != 0) {
    return (oonf_stream_session *)0x0;
  }
  iVar2 = connect(remote_addr._addr._10_4_,(sockaddr *)&remote->v4,0x80);
  if (iVar2 != 0) {
    piVar5 = __errno_location();
    oVar1 = _oonf_stream_socket_subsystem.logging;
    if (*piVar5 == 0x6f) {
      if ((log_global_mask[_oonf_stream_socket_subsystem.logging] & 2) != 0) {
        pcVar3 = netaddr_socket_to_string((netaddr_str *)(nbuf2.buf + 0x36),remote);
        piVar5 = __errno_location();
        pcVar4 = strerror(*piVar5);
        piVar5 = __errno_location();
        oonf_log(LOG_SEVERITY_INFO,oVar1,"src/base/oonf_stream_socket.c",0x11c,(void *)0x0,0,
                 "TCP connection to %s refused: %s (%d)",pcVar3,pcVar4,*piVar5);
      }
      goto LAB_00118208;
    }
    piVar5 = __errno_location();
    oVar1 = _oonf_stream_socket_subsystem.logging;
    if (*piVar5 != 0x73) {
      if ((log_global_mask[_oonf_stream_socket_subsystem.logging] & 4) != 0) {
        pcVar3 = netaddr_socket_to_string((netaddr_str *)(nbuf2.buf + 0x36),remote);
        piVar5 = __errno_location();
        pcVar4 = strerror(*piVar5);
        piVar5 = __errno_location();
        oonf_log(LOG_SEVERITY_WARN,oVar1,"src/base/oonf_stream_socket.c",0x121,(void *)0x0,0,
                 "Cannot connect outgoing tcp connection to %s: %s (%d)",pcVar3,pcVar4,*piVar5);
      }
      goto LAB_00118208;
    }
    nbuf1.buf[0x36] = '\x01';
  }
  netaddr_from_socket((netaddr *)(nbuf1.buf + 0x37),remote);
  poVar6 = _create_session(stream_socket,(os_fd *)(remote_addr._addr + 10),
                           (netaddr *)(nbuf1.buf + 0x37),remote);
  if (poVar6 != (oonf_stream_session *)0x0) {
    poVar6->wait_for_connect = (_Bool)(nbuf1.buf[0x36] & 1);
    return poVar6;
  }
LAB_00118208:
  poVar7 = &(stream_socket->scheduler_entry).fd;
  if (poVar7->fd != -1) {
    close(poVar7->fd);
    poVar7->fd = -1;
  }
  return (oonf_stream_session *)0x0;
}

Assistant:

struct oonf_stream_session *
oonf_stream_connect_to(struct oonf_stream_socket *stream_socket, const union netaddr_socket *remote) {
  struct oonf_stream_session *session;
  struct os_fd sock;
  struct netaddr remote_addr;
  bool wait_for_connect = false;
  struct netaddr_str nbuf1;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str nbuf2;
#endif

  OONF_DEBUG(LOG_STREAM, "Connect TCP socket from %s to %s",
    netaddr_socket_to_string(&nbuf1, &stream_socket->local_socket), netaddr_socket_to_string(&nbuf2, remote));

  if (os_fd_getsocket(&sock, &stream_socket->local_socket, true, 0, NULL, LOG_STREAM)) {
    return NULL;
  }

  if (os_fd_connect(&sock, remote)) {
    if (errno == ECONNREFUSED) {
      /* Don't produce a warning for an failed outgoing TCP connection */
      OONF_INFO(LOG_STREAM, "TCP connection to %s refused: %s (%d)",
        netaddr_socket_to_string(&nbuf1, remote), strerror(errno), errno);
      goto connect_to_error;
    }
    else if (errno != EINPROGRESS) {
      OONF_WARN(LOG_STREAM, "Cannot connect outgoing tcp connection to %s: %s (%d)",
        netaddr_socket_to_string(&nbuf1, remote), strerror(errno), errno);
      goto connect_to_error;
    }
    wait_for_connect = true;
  }

  netaddr_from_socket(&remote_addr, remote);
  session = _create_session(stream_socket, &sock, &remote_addr, remote);
  if (session) {
    session->wait_for_connect = wait_for_connect;
    return session;
  }

  /* fall through */
connect_to_error:
  os_fd_close(&stream_socket->scheduler_entry.fd);
  return NULL;
}